

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

int utf8_isInvalid3(ENCODING *UNUSED_enc,char *p)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  
  bVar1 = p[2];
  if ((char)bVar1 < '\0') {
    cVar2 = *p;
    if ((cVar2 == -0x11) && (p[1] == -0x41)) {
      if (bVar1 < 0xbe) {
LAB_004e0de6:
        bVar1 = p[1];
        if (cVar2 == -0x20) {
          bVar3 = (byte)(bVar1 + 0x40) < 0xe0;
        }
        else {
          bVar3 = true;
          if ((char)bVar1 < '\0') {
            bVar3 = (byte)((cVar2 != -0x13) << 5 | 0x9fU) < bVar1;
          }
        }
        return (int)bVar3;
      }
    }
    else if (bVar1 < 0xc0) goto LAB_004e0de6;
  }
  return 1;
}

Assistant:

static int PTRFASTCALL
utf8_isInvalid3(const ENCODING *UNUSED_P(enc), const char *p)
{
  return UTF8_INVALID3((const unsigned char *)p);
}